

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.h
# Opt level: O2

int sat_solver2_add_const(sat_solver2 *pSat,int iVar,int fCompl,int fMark,int Id)

{
  int in_EAX;
  lit Lits [1];
  lit local_4;
  
  if (-1 < iVar) {
    sat_solver2_addclause(pSat,&local_4,(lit *)&stack0x00000000,fCompl);
    return in_EAX;
  }
  __assert_fail("iVar >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                ,0x10b,"int sat_solver2_add_const(sat_solver2 *, int, int, int, int)");
}

Assistant:

static inline int sat_solver2_add_const( sat_solver2 * pSat, int iVar, int fCompl, int fMark, int Id )
{
    lit Lits[1];
    int Cid;
    assert( iVar >= 0 );

    Lits[0] = toLitCond( iVar, fCompl );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 1, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );
    return 1;
}